

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCode(Parse *pParse,Expr *pExpr,int target)

{
  int p1;
  Expr *pEVar1;
  int op;
  
  if (pParse->pVdbe == (Vdbe *)0x0) {
    return;
  }
  p1 = sqlite3ExprCodeTarget(pParse,pExpr,target);
  if (p1 != target) {
    pEVar1 = sqlite3ExprSkipCollateAndLikely(pExpr);
    if ((pEVar1 == (Expr *)0x0) ||
       ((op = 0x50, (pEVar1->flags & 0x400000) == 0 && (pEVar1->op != 0xb0)))) {
      op = 0x51;
    }
    sqlite3VdbeAddOp2(pParse->pVdbe,op,p1,target);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCode(Parse *pParse, Expr *pExpr, int target){
  int inReg;

  assert( pExpr==0 || !ExprHasVVAProperty(pExpr,EP_Immutable) );
  assert( target>0 && target<=pParse->nMem );
  assert( pParse->pVdbe!=0 || pParse->db->mallocFailed );
  if( pParse->pVdbe==0 ) return;
  inReg = sqlite3ExprCodeTarget(pParse, pExpr, target);
  if( inReg!=target ){
    u8 op;
    Expr *pX = sqlite3ExprSkipCollateAndLikely(pExpr);
    testcase( pX!=pExpr );
    if( ALWAYS(pX)
     && (ExprHasProperty(pX,EP_Subquery) || pX->op==TK_REGISTER)
    ){
      op = OP_Copy;
    }else{
      op = OP_SCopy;
    }
    sqlite3VdbeAddOp2(pParse->pVdbe, op, inReg, target);
  }
}